

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool ScanNumber(ConfigScanner *sc)

{
  size_t __size;
  char cVar1;
  char *__src;
  bool bVar2;
  bool bVar3;
  ValueType VVar4;
  int iVar5;
  char *pcVar6;
  size_t __n;
  double dVar7;
  
  if (sc == (ConfigScanner *)0x0) {
    return false;
  }
  __src = sc->ptr;
  cVar1 = *__src;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    sc->ptr = __src + 1;
    cVar1 = __src[1];
  }
  bVar2 = false;
  if (9 < (byte)(cVar1 - 0x30U)) {
LAB_00142a19:
    __n = (long)sc->ptr - (long)__src;
    __size = __n + 1;
    pcVar6 = (char *)malloc(__size);
    memset(pcVar6,0,__size);
    strncpy(pcVar6,__src,__n);
    if (bVar2) {
      dVar7 = atof(pcVar6);
      sc->current_double = dVar7;
      VVar4 = VTYPE_DOUBLE;
    }
    else {
      iVar5 = atoi(pcVar6);
      sc->current_integer = (long)iVar5;
      VVar4 = VTYPE_INTEGER;
    }
    sc->vtype = VVar4;
    free(pcVar6);
    return true;
  }
  do {
    if (cVar1 == '.') {
      bVar3 = true;
      if (bVar2) {
        return false;
      }
    }
    else {
      bVar3 = bVar2;
      if (9 < (byte)(cVar1 - 0x30U)) goto LAB_00142a19;
    }
    bVar2 = bVar3;
    pcVar6 = sc->ptr;
    sc->ptr = pcVar6 + 1;
    cVar1 = pcVar6[1];
  } while( true );
}

Assistant:

bool ScanNumber(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return false;
	}
	char *start = sc->ptr;
	char ch = *sc->ptr;
	if (ch == '+' || ch == '-')
	{
		sc->ptr++;
		ch = *sc->ptr;
	}
	bool point = false;
	if (ch >= '0' && ch <= '9')
	{
		while (true)
		{
			if (ch == '.')
			{
				if (point)
				{
					return false;
				}
				else
				{
					point = true;
				}
				sc->ptr++;
				ch = *sc->ptr;
			}
			else if (ch >= '0' && ch <= '9')
			{
				sc->ptr++;
				ch = *sc->ptr;
			}
			else
			{
				break;
			}
		}
	}
	size_t length = sc->ptr - start;
	char *temp = (char *)malloc(length + 1);
	memset(temp, 0, length + 1);
	strncpy(temp, start, length);
	if (point)
	{
		sc->current_double = atof(temp);
		sc->vtype = VTYPE_DOUBLE;
	}
	else
	{
		sc->current_integer = atoi(temp);
		sc->vtype = VTYPE_INTEGER;
	}
	free(temp);
	return true;
}